

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx *dctx)

{
  uint uVar1;
  ZSTD_DDictHashSet *pZVar2;
  ZSTD_DDict *pZVar3;
  uint uVar4;
  XXH64_hash_t XVar5;
  ulong uVar6;
  ulong uVar7;
  uint local_2c;
  
  if (dctx->ddict != (ZSTD_DDict *)0x0) {
    pZVar2 = dctx->ddictSet;
    uVar1 = (dctx->fParams).dictID;
    local_2c = uVar1;
    XVar5 = XXH64(&local_2c,4,0);
    uVar6 = pZVar2->ddictPtrTableSize - 1;
    uVar7 = XVar5 & uVar6;
    while (uVar4 = ZSTD_getDictID_fromDDict(pZVar2->ddictPtrTable[uVar7]),
          uVar4 != 0 && uVar4 != uVar1) {
      uVar7 = (uVar7 & uVar6) + 1;
    }
    pZVar3 = pZVar2->ddictPtrTable[uVar7];
    if (pZVar3 != (ZSTD_DDict *)0x0) {
      ZSTD_freeDDict(dctx->ddictLocal);
      dctx->ddictLocal = (ZSTD_DDict *)0x0;
      dctx->ddict = (ZSTD_DDict *)0x0;
      dctx->dictID = (dctx->fParams).dictID;
      dctx->ddict = pZVar3;
      dctx->dictUses = ZSTD_use_indefinitely;
    }
  }
  return;
}

Assistant:

static void ZSTD_DCtx_selectFrameDDict(ZSTD_DCtx* dctx) {
    assert(dctx->refMultipleDDicts && dctx->ddictSet);
    DEBUGLOG(4, "Adjusting DDict based on requested dict ID from frame");
    if (dctx->ddict) {
        const ZSTD_DDict* frameDDict = ZSTD_DDictHashSet_getDDict(dctx->ddictSet, dctx->fParams.dictID);
        if (frameDDict) {
            DEBUGLOG(4, "DDict found!");
            ZSTD_clearDict(dctx);
            dctx->dictID = dctx->fParams.dictID;
            dctx->ddict = frameDDict;
            dctx->dictUses = ZSTD_use_indefinitely;
        }
    }
}